

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O0

void __thiscall TURBOLINECOUNT::CLineCount::~CLineCount(CLineCount *this)

{
  CLineCount *this_local;
  
  if (((this->m_auto_close & 1U) != 0) && ((this->m_opened & 1U) != 0)) {
    ::close(this->m_fh);
  }
  std::vector<long,_std::allocator<long>_>::~vector(&this->m_threadlinecounts);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->m_threads);
  std::__cxx11::string::~string((string *)&this->m_lasterrorstring);
  return;
}

Assistant:

CLineCount::~CLineCount()
{
	if (m_auto_close && m_opened)
	{
		LCCLOSEFILE(m_fh);
	}
}